

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCore.c
# Opt level: O0

int Dar_ManRewrite(Aig_Man_t *pAig,Dar_RwrPar_t *pPars)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  Aig_Obj_t *pAVar8;
  abctime aVar9;
  uint uVar10;
  int local_84;
  int local_70;
  int nLeavesOld;
  int nMffcSize;
  int Counter;
  abctime clkStart;
  abctime clk;
  int Required;
  int nNodeAfter;
  int nNodeBefore;
  int nNodesOld;
  int k;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Dar_Cut_t *pCut;
  Dar_Man_t *p;
  Dar_RwrPar_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  clkStart = 0;
  nLeavesOld = 0;
  p = (Dar_Man_t *)pPars;
  pPars_local = (Dar_RwrPar_t *)pAig;
  Dar_LibPrepare(pPars->nSubgMax);
  pCut = (Dar_Cut_t *)Dar_ManStart((Aig_Man_t *)pPars_local,(Dar_RwrPar_t *)p);
  if (*(int *)((long)&p->pMemCuts + 4) != 0) {
    pVVar7 = Saig_ManComputeSwitchProbs((Aig_Man_t *)pPars_local,0x30,0x10,1);
    *(Vec_Int_t **)&pPars_local[0xc].fVeryVerbose = pVVar7;
  }
  Aig_ManCleanup((Aig_Man_t *)pPars_local);
  if (*(int *)(*(long *)pCut + 8) != 0) {
    Aig_ManFanoutStart((Aig_Man_t *)pPars_local);
  }
  if (*(int *)(*(long *)pCut + 0xc) != 0) {
    Aig_ManStartReverseLevels((Aig_Man_t *)pPars_local,0);
  }
  _nMffcSize = Abc_Clock();
  iVar4 = Aig_ManNodeNum((Aig_Man_t *)pPars_local);
  *(int *)&pCut[0x72].field_0x4 = iVar4;
  nNodeAfter = Vec_PtrSize(*(Vec_Ptr_t **)&pPars_local->fVeryVerbose);
  for (nNodesOld = 0; iVar4 = nNodesOld,
      iVar5 = Vec_PtrSize(*(Vec_Ptr_t **)&pPars_local->fVeryVerbose), iVar4 < iVar5;
      nNodesOld = nNodesOld + 1) {
    pObjNew = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)&pPars_local->fVeryVerbose,nNodesOld);
    if (pObjNew != (Aig_Obj_t *)0x0) {
      lVar1._0_4_ = pPars_local[0xd].fPower;
      lVar1._4_4_ = pPars_local[0xd].fRecycle;
      if (((lVar1 != 0) && ((nNodesOld & 0x100U) == 0)) &&
         (aVar9 = Abc_Clock(), lVar2._0_4_ = pPars_local[0xd].fPower,
         lVar2._4_4_ = pPars_local[0xd].fRecycle, lVar2 < aVar9)) break;
      iVar4 = Aig_ObjIsNode(pObjNew);
      if (iVar4 != 0) {
        if (nNodeAfter < nNodesOld) break;
        if ((*(int *)&p->pManCnf != 0) && (nLeavesOld = nLeavesOld + 1, nLeavesOld % 50000 == 0)) {
          iVar4 = Aig_DagSize(pObjNew);
          iVar5 = Vec_PtrSize(*(Vec_Ptr_t **)pCut[1].pLeaves);
          if (iVar4 < iVar5 / 100) {
            Dar_ManCutsRestart((Dar_Man_t *)pCut,pObjNew);
          }
        }
        pCut[0x72].pLeaves[0] = pCut[0x72].pLeaves[0] + 1;
        clkStart = Abc_Clock();
        Dar_ObjSetCuts(pObjNew,(Dar_Cut_t *)0x0);
        Dar_ObjComputeCuts_rec((Dar_Man_t *)pCut,pObjNew);
        aVar9 = Abc_Clock();
        *(abctime *)(pCut[0x73].pLeaves + 2) =
             (aVar9 - clkStart) + *(long *)(pCut[0x73].pLeaves + 2);
        pObj = (Aig_Obj_t *)Dar_ObjCuts(pObjNew);
        nNodeBefore = 0;
        while ((nNodeBefore < (int)(uint)(byte)((ulong)*(undefined8 *)&pObjNew->field_0x18 >> 0x38)
               && (((*(uint *)((long)&pObj->field_0 + 4) >> 0x1c & 1) == 0 ||
                   ((*(uint *)((long)&pObj->field_0 + 4) >> 0x1d != 0 &&
                    (((*(uint *)((long)&pObj->field_0 + 4) >> 0x1d != 1 ||
                      (*(int *)&pObj->pFanin0 == pObjNew->Id)) ||
                     (pAVar8 = Aig_ManObj(*(Aig_Man_t **)pCut->pLeaves,*(int *)&pObj->pFanin0),
                     pAVar8 == (Aig_Obj_t *)0x0))))))))) {
          nNodeBefore = nNodeBefore + 1;
          pObj = (Aig_Obj_t *)&pObj->field_0x18;
        }
        if (nNodeBefore < (int)(uint)(byte)((ulong)*(undefined8 *)&pObjNew->field_0x18 >> 0x38)) {
          if (1 < *(uint *)((long)&pObj->field_0 + 4) >> 0x1d) {
            __assert_fail("pCut->nLeaves < 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCore.c"
                          ,0x95,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
          }
          if (*(uint *)((long)&pObj->field_0 + 4) >> 0x1d == 0) {
            if ((((ulong)(pObj->field_0).pNext & 0xffff00000000) != 0) &&
               (((ulong)(pObj->field_0).pNext & 0xffff00000000) != 0xffff00000000)) {
              __assert_fail("pCut->uTruth == 0 || pCut->uTruth == 0xFFFF",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCore.c"
                            ,0x98,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
            }
            pAVar8 = Aig_ManConst1(*(Aig_Man_t **)pCut->pLeaves);
            _k = Aig_NotCond(pAVar8,(uint)(((ulong)(pObj->field_0).pNext & 0xffff00000000) == 0));
          }
          else {
            if ((((ulong)(pObj->field_0).pNext & 0xffff00000000) != 0xaaaa00000000) &&
               (((ulong)(pObj->field_0).pNext & 0xffff00000000) != 0x555500000000)) {
              __assert_fail("pCut->uTruth == 0xAAAA || pCut->uTruth == 0x5555",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCore.c"
                            ,0x9d,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
            }
            pAVar8 = Aig_ManObj(*(Aig_Man_t **)pCut->pLeaves,*(int *)&pObj->pFanin0);
            _k = Aig_NotCond(pAVar8,(uint)(((ulong)(pObj->field_0).pNext & 0xffff00000000) ==
                                          0x555500000000));
          }
          Dar_ObjSetCuts(pObjNew,(Dar_Cut_t *)0x0);
          Aig_ObjReplace((Aig_Man_t *)pPars_local,pObjNew,_k,*(int *)(*(long *)pCut + 0xc));
        }
        else {
          pCut[2].pLeaves[0] = -1;
          local_70 = -1;
          lVar3._0_4_ = pPars_local[7].fVerbose;
          lVar3._4_4_ = pPars_local[7].fVeryVerbose;
          if (lVar3 == 0) {
            local_84 = 1000000000;
          }
          else {
            local_84 = Aig_ObjRequiredLevel((Aig_Man_t *)pPars_local,pObjNew);
          }
          clk._0_4_ = local_84;
          pObj = (Aig_Obj_t *)Dar_ObjCuts(pObjNew);
          for (nNodeBefore = 0;
              nNodeBefore < (int)(uint)(byte)((ulong)*(undefined8 *)&pObjNew->field_0x18 >> 0x38);
              nNodeBefore = nNodeBefore + 1) {
            if ((*(uint *)((long)&pObj->field_0 + 4) >> 0x1c & 1) != 0) {
              uVar6 = *(uint *)((long)&pObj->field_0 + 4);
              if (*(uint *)((long)&pObj->field_0 + 4) >> 0x1d == 3) {
                uVar10 = *(uint *)((long)&pObj->field_0 + 4) >> 0x1d;
                *(uint *)((long)&pObj->field_0 + 4) =
                     *(uint *)((long)&pObj->field_0 + 4) & 0x1fffffff | (uVar10 + 1) * 0x20000000;
                *(undefined4 *)((long)&pObj->pFanin0 + (ulong)uVar10 * 4) = 0;
              }
              Dar_LibEval((Dar_Man_t *)pCut,pObjNew,(Dar_Cut_t *)pObj,(int)clk,&local_70);
              *(uint *)((long)&pObj->field_0 + 4) =
                   *(uint *)((long)&pObj->field_0 + 4) & 0x1fffffff | uVar6 & 0xe0000000;
            }
            pObj = (Aig_Obj_t *)&pObj->field_0x18;
          }
          if ((0 < pCut[2].pLeaves[0]) ||
             ((pCut[2].pLeaves[0] == 0 && (*(int *)(*(long *)pCut + 0x10) != 0)))) {
            Dar_ObjSetCuts(pObjNew,(Dar_Cut_t *)0x0);
            Required = Aig_ManNodeNum((Aig_Man_t *)pPars_local);
            pAVar8 = Dar_LibBuildBest((Dar_Man_t *)pCut);
            _k = pAVar8;
            uVar6 = Aig_ObjPhaseReal(pAVar8);
            _k = Aig_NotCond(pAVar8,uVar6 ^ (uint)(*(ulong *)&pObjNew->field_0x18 >> 3) & 1);
            pAVar8 = Aig_Regular(_k);
            if ((int)clk <
                (int)((uint)((ulong)*(undefined8 *)&pAVar8->field_0x18 >> 0x20) & 0xffffff)) {
              __assert_fail("(int)Aig_Regular(pObjNew)->Level <= Required",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCore.c"
                            ,0xc0,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
            }
            Aig_ObjReplace((Aig_Man_t *)pPars_local,pObjNew,_k,*(int *)(*(long *)pCut + 0xc));
            clk._4_4_ = Aig_ManNodeNum((Aig_Man_t *)pPars_local);
            if (Required - clk._4_4_ < pCut[2].pLeaves[0]) {
              __assert_fail("p->GainBest <= nNodeBefore - nNodeAfter",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCore.c"
                            ,0xc5,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
            }
            pCut[0x28].pLeaves[(long)pCut[2].pLeaves[2] + -2] =
                 (Required - clk._4_4_) + pCut[0x28].pLeaves[(long)pCut[2].pLeaves[2] + -2];
          }
        }
      }
    }
  }
  aVar9 = Abc_Clock();
  *(abctime *)(pCut[0x74].pLeaves + 2) = aVar9 - _nMffcSize;
  *(long *)pCut[0x74].pLeaves =
       (*(long *)(pCut[0x74].pLeaves + 2) - *(long *)(pCut[0x73].pLeaves + 2)) -
       *(long *)(pCut + 0x74);
  Dar_ManCutsFree((Dar_Man_t *)pCut);
  if (*(int *)(*(long *)pCut + 8) != 0) {
    Aig_ManFanoutStop((Aig_Man_t *)pPars_local);
  }
  if (*(int *)(*(long *)pCut + 0xc) != 0) {
    Aig_ManStopReverseLevels((Aig_Man_t *)pPars_local);
  }
  if (*(long *)&pPars_local[0xc].fVeryVerbose != 0) {
    Vec_IntFree(*(Vec_Int_t **)&pPars_local[0xc].fVeryVerbose);
    *(undefined8 *)&pPars_local[0xc].fVeryVerbose = 0;
  }
  Dar_ManStop((Dar_Man_t *)pCut);
  Aig_ManCheckPhase((Aig_Man_t *)pPars_local);
  iVar4 = Aig_ManCheck((Aig_Man_t *)pPars_local);
  if (iVar4 == 0) {
    printf("Aig_ManRewrite: The network check has failed.\n");
  }
  pAig_local._4_4_ = (uint)(iVar4 != 0);
  return pAig_local._4_4_;
}

Assistant:

int Dar_ManRewrite( Aig_Man_t * pAig, Dar_RwrPar_t * pPars )
{
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Dar_Man_t * p;
//    Bar_Progress_t * pProgress;
    Dar_Cut_t * pCut;
    Aig_Obj_t * pObj, * pObjNew;
    int i, k, nNodesOld, nNodeBefore, nNodeAfter, Required;
    abctime clk = 0, clkStart;
    int Counter = 0;
    int nMffcSize;//, nMffcGains[MAX_VAL+1][MAX_VAL+1] = {{0}};
    // prepare the library
    Dar_LibPrepare( pPars->nSubgMax ); 
    // create rewriting manager
    p = Dar_ManStart( pAig, pPars );
    if ( pPars->fPower )
        pAig->vProbs = Saig_ManComputeSwitchProbs( pAig, 48, 16, 1 );
    // remove dangling nodes
    Aig_ManCleanup( pAig );
    // if updating levels is requested, start fanout and timing
    if ( p->pPars->fFanout )
        Aig_ManFanoutStart( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStartReverseLevels( pAig, 0 );
    // set elementary cuts for the PIs
//    Dar_ManCutsStart( p );
    // resynthesize each node once
    clkStart = Abc_Clock();
    p->nNodesInit = Aig_ManNodeNum(pAig);
    nNodesOld = Vec_PtrSize( pAig->vObjs );

//    pProgress = Bar_ProgressStart( stdout, nNodesOld );
    Aig_ManForEachObj( pAig, pObj, i )
//    pProgress = Bar_ProgressStart( stdout, 100 );
//    Aig_ManOrderStart( pAig );
//    Aig_ManForEachNodeInOrder( pAig, pObj )
    {
        if ( pAig->Time2Quit && !(i & 256) && Abc_Clock() > pAig->Time2Quit )
            break;
//        Bar_ProgressUpdate( pProgress, 100*pAig->nAndPrev/pAig->nAndTotal, NULL );
//        Bar_ProgressUpdate( pProgress, i, NULL );
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( i > nNodesOld )
//        if ( p->pPars->fUseZeros && i > nNodesOld )
            break;
        if ( pPars->fRecycle && ++Counter % 50000 == 0 && Aig_DagSize(pObj) < Vec_PtrSize(p->vCutNodes)/100 )
        {
//            printf( "Counter = %7d.  Node = %7d.  Dag = %5d. Vec = %5d.\n", 
//                Counter, i, Aig_DagSize(pObj), Vec_PtrSize(p->vCutNodes) );
//            fflush( stdout );
            Dar_ManCutsRestart( p, pObj );
        }

        // consider freeing the cuts
//        if ( (i & 0xFFF) == 0 && Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) > 100 )
//            Dar_ManCutsStart( p );

        // compute cuts for the node
        p->nNodesTried++;
clk = Abc_Clock();
        Dar_ObjSetCuts( pObj, NULL );
        Dar_ObjComputeCuts_rec( p, pObj );
p->timeCuts += Abc_Clock() - clk;

        // check if there is a trivial cut
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves == 0 || (pCut->nLeaves == 1 && pCut->pLeaves[0] != pObj->Id && Aig_ManObj(p->pAig, pCut->pLeaves[0])) )
                break;
        if ( k < (int)pObj->nCuts )
        {
            assert( pCut->nLeaves < 2 );
            if ( pCut->nLeaves == 0 ) // replace by constant
            {
                assert( pCut->uTruth == 0 || pCut->uTruth == 0xFFFF );
                pObjNew = Aig_NotCond( Aig_ManConst1(p->pAig), pCut->uTruth==0 );
            }
            else
            {
                assert( pCut->uTruth == 0xAAAA || pCut->uTruth == 0x5555 );
                pObjNew = Aig_NotCond( Aig_ManObj(p->pAig, pCut->pLeaves[0]), pCut->uTruth==0x5555 );
            }
            // remove the old cuts
            Dar_ObjSetCuts( pObj, NULL );
            // replace the node
            Aig_ObjReplace( pAig, pObj, pObjNew, p->pPars->fUpdateLevel );
            continue;
        }

        // evaluate the cuts
        p->GainBest = -1;
        nMffcSize   = -1;
        Required    = pAig->vLevelR? Aig_ObjRequiredLevel(pAig, pObj) : ABC_INFINITY;
        Dar_ObjForEachCut( pObj, pCut, k )
        {
            int nLeavesOld = pCut->nLeaves;
            if ( pCut->nLeaves == 3 )
                pCut->pLeaves[pCut->nLeaves++] = 0;
            Dar_LibEval( p, pObj, pCut, Required, &nMffcSize );
            pCut->nLeaves = nLeavesOld; 
        }
        // check the best gain
        if ( !(p->GainBest > 0 || (p->GainBest == 0 && p->pPars->fUseZeros)) )
        {
//            Aig_ObjOrderAdvance( pAig );
            continue;
        }
//        nMffcGains[p->GainBest < MAX_VAL ? p->GainBest : MAX_VAL][nMffcSize < MAX_VAL ? nMffcSize : MAX_VAL]++;
        // remove the old cuts
        Dar_ObjSetCuts( pObj, NULL );
        // if we end up here, a rewriting step is accepted
        nNodeBefore = Aig_ManNodeNum( pAig );
        pObjNew = Dar_LibBuildBest( p ); // pObjNew can be complemented!
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjPhaseReal(pObjNew) ^ pObj->fPhase );
        assert( (int)Aig_Regular(pObjNew)->Level <= Required );
        // replace the node
        Aig_ObjReplace( pAig, pObj, pObjNew, p->pPars->fUpdateLevel );
        // compare the gains
        nNodeAfter = Aig_ManNodeNum( pAig );
        assert( p->GainBest <= nNodeBefore - nNodeAfter );
        // count gains of this class
        p->ClassGains[p->ClassBest] += nNodeBefore - nNodeAfter;
    }
//    Aig_ManOrderStop( pAig );
/*
    printf( "Distribution of gain (row) by MFFC size (column) %s 0-costs:\n", p->pPars->fUseZeros? "with":"without" );
    for ( k = 0; k <= MAX_VAL; k++ )
        printf( "<%4d> ", k );
    printf( "\n" );
    for ( i = 0; i <= MAX_VAL; i++ )
    {
        for ( k = 0; k <= MAX_VAL; k++ )
            printf( "%6d ", nMffcGains[i][k] );
        printf( "\n" );
    }
*/

p->timeTotal = Abc_Clock() - clkStart;
p->timeOther = p->timeTotal - p->timeCuts - p->timeEval;

//    Bar_ProgressStop( pProgress );
    Dar_ManCutsFree( p );
    // put the nodes into the DFS order and reassign their IDs
//    Aig_NtkReassignIds( p );
    // fix the levels
//    Aig_ManVerifyLevel( pAig );
    if ( p->pPars->fFanout )
        Aig_ManFanoutStop( pAig );
    if ( p->pPars->fUpdateLevel )
    {
//        Aig_ManVerifyReverseLevel( pAig );
        Aig_ManStopReverseLevels( pAig );
    }
    if ( pAig->vProbs )
    {
        Vec_IntFree( pAig->vProbs );
        pAig->vProbs = NULL;
    }
    // stop the rewriting manager
    Dar_ManStop( p );
    Aig_ManCheckPhase( pAig );
    // check
    if ( !Aig_ManCheck( pAig ) )
    {
        printf( "Aig_ManRewrite: The network check has failed.\n" );
        return 0;
    }
    return 1;
}